

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_alloc.c
# Opt level: O0

light_pcapng light_alloc_block(uint32_t block_type,uint32_t *block_body,uint32_t block_body_length)

{
  light_pcapng p_Var1;
  uint32_t *puVar2;
  uint in_EDX;
  void *in_RSI;
  uint32_t in_EDI;
  int32_t block_body_size;
  uint32_t actual_size;
  _light_pcapng *pcapng_block;
  
  p_Var1 = (light_pcapng)calloc(1,0x20);
  p_Var1->block_type = in_EDI;
  if ((in_EDX & 3) != 0) {
    in_EDX = ((in_EDX >> 2) + 1) * 4;
  }
  p_Var1->block_total_lenght = in_EDX + 0xc;
  if (0 < (int)in_EDX) {
    puVar2 = (uint32_t *)calloc(1,(long)(int)in_EDX);
    p_Var1->block_body = puVar2;
    memcpy(p_Var1->block_body,in_RSI,(long)(int)in_EDX);
  }
  p_Var1->next_block = (_light_pcapng *)0x0;
  p_Var1->options = (_light_option *)0x0;
  return p_Var1;
}

Assistant:

light_pcapng light_alloc_block(uint32_t block_type, const uint32_t *block_body, uint32_t block_body_length)
{
	struct _light_pcapng *pcapng_block = calloc(1, sizeof(struct _light_pcapng));
	uint32_t actual_size = 0;
	int32_t block_body_size;

	pcapng_block->block_type = block_type;

	PADD32(block_body_length, &actual_size);

	pcapng_block->block_total_lenght = actual_size + 2 * sizeof(pcapng_block->block_total_lenght) + sizeof(pcapng_block->block_type); // This value MUST be a multiple of 4.
	block_body_size = actual_size;

	if (block_body_size > 0) {
		pcapng_block->block_body = calloc(1, block_body_size);
		memcpy(pcapng_block->block_body, block_body, block_body_size);
	}

	pcapng_block->next_block = NULL;
	pcapng_block->options = NULL;

	return pcapng_block;
}